

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec3 __thiscall djb::microfacet::u2_to_h2(microfacet *this,vec2 *u,vec3 *wi,args *args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined8 extraout_XMM0_Qa;
  float fVar8;
  float fVar9;
  vec3 vVar10;
  vec3 local_40;
  vec3 local_30;
  
  local_40 = djb::operator*(&args->minv,wi);
  local_30 = normalize(&local_40);
  fVar9 = local_30.z;
  (*(this->super_brdf)._vptr_brdf[0xc])(this,u);
  fVar7 = (float)extraout_XMM0_Qa;
  fVar8 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  uVar1 = (args->minv).r[0].x;
  uVar4 = (args->minv).r[0].y;
  uVar2 = (args->minv).r[1].x;
  uVar5 = (args->minv).r[1].y;
  uVar3 = (args->minv).r[2].x;
  uVar6 = (args->minv).r[2].y;
  local_40.y = fVar9 * (float)uVar6 + fVar7 * (float)uVar4 + (float)uVar5 * fVar8;
  local_40.x = fVar9 * (float)uVar3 + fVar7 * (float)uVar1 + (float)uVar2 * fVar8;
  local_40.z = fVar9 * (args->minv).r[2].z +
               (args->minv).r[0].z * fVar7 + (args->minv).r[1].z * fVar8;
  vVar10 = normalize(&local_40);
  return vVar10;
}

Assistant:

vec3
microfacet::u2_to_h2(const vec2 &u, const vec3 &wi, const args &args) const
{
	vec3 wi_std = normalize(args.minv * wi);
	vec3 wm_std = u2_to_h2_std(u, wi_std);
	vec3 wm = normalize(transpose(args.minv) * wm_std);

	return wm;
}